

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::setState
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,DataFlowState *newState)

{
  char *pcVar1;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> local_b8;
  bool local_20;
  
  this->isStateSplit = false;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&this->state
             ,(SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)newState);
  (this->state).reachable = newState->reachable;
  memset(&local_b8,0,0xa0);
  pcVar1 = local_b8.firstElement;
  local_b8.len = 0;
  local_b8.cap = 2;
  local_20 = true;
  local_b8.data_ = (pointer)pcVar1;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
             &this->stateWhenTrue,&local_b8);
  (this->stateWhenTrue).reachable = local_20;
  if (local_b8.data_ != (pointer)pcVar1) {
    operator_delete(local_b8.data_);
  }
  memset(&local_b8,0,0xa0);
  local_b8.len = 0;
  local_b8.cap = 2;
  local_20 = true;
  local_b8.data_ = (pointer)pcVar1;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
             &this->stateWhenFalse,&local_b8);
  (this->stateWhenFalse).reachable = local_20;
  if (local_b8.data_ != (pointer)pcVar1) {
    operator_delete(local_b8.data_);
  }
  return;
}

Assistant:

void setState(TState newState) {
        isStateSplit = false;
        state = std::move(newState);
        stateWhenTrue = {};
        stateWhenFalse = {};
    }